

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

void __thiscall capnp::DynamicStruct::Builder::set(Builder *this,Field field,Reader *value)

{
  int *__return_storage_ptr__;
  uint *__return_storage_ptr___00;
  ReaderFor<double> value_00;
  double value_01;
  PointerBuilder builder;
  Reader value_02;
  Reader value_03;
  Reader value_04;
  Field field_00;
  Field field_01;
  Field field_02;
  Field field_03;
  NoInfer<unsigned_short> value_05;
  bool bVar1;
  ReaderFor<bool> value_06;
  ReaderFor<signed_char> value_07;
  int8_t value_08;
  char m;
  ReaderFor<unsigned_char> value_09;
  uint8_t value_10;
  uchar m_00;
  Which WVar2;
  Which WVar3;
  ReaderFor<short> value_11;
  int16_t value_12;
  short m_01;
  ReaderFor<unsigned_short> value_13;
  unsigned_short m_02;
  uint16_t uVar4;
  ReaderFor<int> value_14;
  int32_t value_15;
  int m_03;
  ReaderFor<unsigned_int> value_16;
  uint m_04;
  StructDataOffset SVar5;
  uint32_t uVar6;
  StructPointerOffset SVar7;
  Type TVar8;
  ReaderFor<long> value_17;
  int64_t value_18;
  long m_05;
  ReaderFor<unsigned_long> value_19;
  unsigned_long m_06;
  uint64_t uVar9;
  Own<capnp::ClientHook> *cap;
  NullableValue<capnp::StructSchema::Field> *other;
  Field *pFVar10;
  ReaderFor<float> value_20;
  float value_21;
  ReaderFor<capnp::DynamicEnum> RVar11;
  ReaderFor<capnp::Data> value_22;
  Iterator IVar12;
  Reader local_830;
  Schema local_7e8;
  Schema SStack_7e0;
  uint local_7d8;
  undefined4 uStack_7d4;
  SegmentReader *pSStack_7d0;
  CapTableReader *local_7c8;
  void *pvStack_7c0;
  WirePointer *local_7b8;
  StructDataBitCount SStack_7b0;
  StructPointerCount SStack_7ac;
  undefined2 uStack_7aa;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined1 auStack_768 [8];
  Field field_1;
  undefined1 local_718 [8];
  Iterator __end3;
  undefined1 local_6f8 [8];
  Iterator __begin3;
  FieldSubset *__range3;
  Reader local_650;
  RawBrandedSchema *local_608;
  undefined8 uStack_600;
  SegmentReader *local_5f8;
  CapTableReader *pCStack_5f0;
  void *local_5e8;
  WirePointer *pWStack_5e0;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  Maybe<capnp::StructSchema::Field> local_5c8;
  undefined1 local_580 [8];
  NullableValue<capnp::StructSchema::Field> unionField;
  Builder local_4f8;
  undefined1 local_4b8 [8];
  BuilderFor<capnp::DynamicStruct> dst;
  ReaderFor<capnp::DynamicStruct> src;
  Fault local_430;
  Fault f_5;
  Schema local_420;
  undefined1 local_418 [8];
  ReaderFor<capnp::DynamicCapability> capability;
  InterfaceSchema interfaceType;
  Fault f_4;
  CapTableReader *local_3e8;
  WirePointer *local_3e0;
  undefined8 local_3d8;
  ReaderFor<capnp::DynamicCapability> local_3d0;
  ReaderFor<capnp::DynamicStruct> local_3b8;
  ReaderFor<capnp::DynamicList> local_380;
  ArrayPtr<const_unsigned_char> local_340;
  StringPtr local_330;
  PointerBuilder local_320;
  undefined1 local_308 [8];
  Builder target;
  Fault local_2d8;
  Fault f_3;
  undefined1 local_2c8 [8];
  ReaderFor<capnp::DynamicStruct> structValue;
  StructSchema structType;
  Fault local_270;
  Fault f_2;
  undefined1 local_258 [8];
  ReaderFor<capnp::DynamicList> listValue;
  ListSchema listType;
  PointerBuilder local_1f8;
  StringPtr local_1e0;
  PointerBuilder local_1d0;
  Fault local_1b8;
  Fault f_1;
  undefined1 local_198 [8];
  DynamicEnum enumValue;
  Enumerant local_168;
  Schema local_128;
  EnumSchema enumSchema;
  undefined1 local_118 [4];
  uint16_t rawValue;
  Reader dval;
  Reader slot;
  Type type;
  Reader proto;
  Fault local_28;
  Fault f;
  Reader *value_local;
  Builder *this_local;
  
  f.exception = (Exception *)StructSchema::Field::getContainingStruct(&field);
  bVar1 = Schema::operator==((Schema *)&f,(Schema *)this);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[39]>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x1fe,FAILED,"field.getContainingStruct() == schema",
               "\"`field` is not a field of this struct.\"",
               (char (*) [39])"`field` is not a field of this struct.");
    kj::_::Debug::Fault::fatal(&local_28);
  }
  setInUnion(this,field);
  StructSchema::Field::getProto((Reader *)&type.field_4,&field);
  join_0x00000010_0x00000000_ = StructSchema::Field::getType(&field);
  WVar2 = capnp::schema::Field::Reader::which((Reader *)&type.field_4);
  if (WVar2 == SLOT) {
    __return_storage_ptr__ = &dval._reader.nestingLimit;
    capnp::schema::Field::Reader::getSlot((Reader *)__return_storage_ptr__,(Reader *)&type.field_4);
    capnp::schema::Field::Slot::Reader::getDefaultValue
              ((Reader *)local_118,(Reader *)__return_storage_ptr__);
    WVar3 = capnp::Type::which((Type *)&slot._reader.nestingLimit);
    switch(WVar3) {
    case VOID:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      DynamicValue::Reader::as<capnp::Void>(value);
      _::StructBuilder::setDataField<capnp::Void>(&this->builder,SVar5);
      break;
    case BOOL:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_06 = DynamicValue::Reader::as<bool>(value);
      bVar1 = capnp::schema::Value::Reader::getBool((Reader *)local_118);
      bVar1 = (anonymous_namespace)::bitCast<bool,bool>(bVar1);
      _::StructBuilder::setDataField<bool>(&this->builder,SVar5,value_06,bVar1);
      break;
    case INT8:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_07 = DynamicValue::Reader::as<signed_char>(value);
      value_08 = capnp::schema::Value::Reader::getInt8((Reader *)local_118);
      m = (anonymous_namespace)::bitCast<signed_char,signed_char>(value_08);
      _::StructBuilder::setDataField<signed_char>(&this->builder,SVar5,value_07,m);
      break;
    case INT16:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_11 = DynamicValue::Reader::as<short>(value);
      value_12 = capnp::schema::Value::Reader::getInt16((Reader *)local_118);
      m_01 = (anonymous_namespace)::bitCast<short,short>(value_12);
      _::StructBuilder::setDataField<short>(&this->builder,SVar5,value_11,m_01);
      break;
    case INT32:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_14 = DynamicValue::Reader::as<int>(value);
      value_15 = capnp::schema::Value::Reader::getInt32((Reader *)local_118);
      m_03 = (anonymous_namespace)::bitCast<int,int>(value_15);
      _::StructBuilder::setDataField<int>(&this->builder,SVar5,value_14,m_03);
      break;
    case INT64:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_17 = DynamicValue::Reader::as<long>(value);
      value_18 = capnp::schema::Value::Reader::getInt64((Reader *)local_118);
      m_05 = (anonymous_namespace)::bitCast<long,long>(value_18);
      _::StructBuilder::setDataField<long>(&this->builder,SVar5,value_17,m_05);
      break;
    case UINT8:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_09 = DynamicValue::Reader::as<unsigned_char>(value);
      value_10 = capnp::schema::Value::Reader::getUint8((Reader *)local_118);
      m_00 = (anonymous_namespace)::bitCast<unsigned_char,unsigned_char>(value_10);
      _::StructBuilder::setDataField<unsigned_char>(&this->builder,SVar5,value_09,m_00);
      break;
    case UINT16:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_13 = DynamicValue::Reader::as<unsigned_short>(value);
      uVar4 = capnp::schema::Value::Reader::getUint16((Reader *)local_118);
      m_02 = (anonymous_namespace)::bitCast<unsigned_short,unsigned_short>(uVar4);
      _::StructBuilder::setDataField<unsigned_short>(&this->builder,SVar5,value_13,m_02);
      break;
    case UINT32:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_16 = DynamicValue::Reader::as<unsigned_int>(value);
      uVar6 = capnp::schema::Value::Reader::getUint32((Reader *)local_118);
      m_04 = (anonymous_namespace)::bitCast<unsigned_int,unsigned_int>(uVar6);
      _::StructBuilder::setDataField<unsigned_int>(&this->builder,SVar5,value_16,m_04);
      break;
    case UINT64:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_19 = DynamicValue::Reader::as<unsigned_long>(value);
      uVar9 = capnp::schema::Value::Reader::getUint64((Reader *)local_118);
      m_06 = (anonymous_namespace)::bitCast<unsigned_long,unsigned_long>(uVar9);
      _::StructBuilder::setDataField<unsigned_long>(&this->builder,SVar5,value_19,m_06);
      break;
    case FLOAT32:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_20 = DynamicValue::Reader::as<float>(value);
      value_21 = capnp::schema::Value::Reader::getFloat32((Reader *)local_118);
      uVar6 = (anonymous_namespace)::bitCast<unsigned_int,float>(value_21);
      _::StructBuilder::setDataField<float>(&this->builder,SVar5,value_20,uVar6);
      break;
    case FLOAT64:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_00 = DynamicValue::Reader::as<double>(value);
      value_01 = capnp::schema::Value::Reader::getFloat64((Reader *)local_118);
      uVar9 = (anonymous_namespace)::bitCast<unsigned_long,double>(value_01);
      _::StructBuilder::setDataField<double>(&this->builder,SVar5,value_00,uVar9);
      break;
    case TEXT:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar7 = assumePointerOffset(uVar6);
      _::StructBuilder::getPointerField(&local_1d0,&this->builder,SVar7);
      local_1e0.content = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(value);
      _::PointerBuilder::setBlob<capnp::Text>(&local_1d0,(Reader)local_1e0.content);
      break;
    case DATA:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar7 = assumePointerOffset(uVar6);
      _::StructBuilder::getPointerField(&local_1f8,&this->builder,SVar7);
      value_22 = DynamicValue::Reader::as<capnp::Data>(value);
      _::PointerBuilder::setBlob<capnp::Data>
                (&local_1f8,(Reader)value_22.super_ArrayPtr<const_unsigned_char>);
      break;
    case LIST:
      join_0x00000010_0x00000000_ = (Type)capnp::Type::asList((Type *)&slot._reader.nestingLimit);
      DynamicValue::Reader::as<capnp::DynamicList>((ReaderFor<capnp::DynamicList> *)local_258,value)
      ;
      _f_2 = (Type)DynamicList::Reader::getSchema((Reader *)local_258);
      bVar1 = ListSchema::operator==
                        ((ListSchema *)&f_2,(ListSchema *)&listValue.reader.nestingLimit);
      if (bVar1) {
        uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
        SVar7 = assumePointerOffset(uVar6);
        _::StructBuilder::getPointerField((PointerBuilder *)&structType,&this->builder,SVar7);
        _::PointerBuilder::setList
                  ((PointerBuilder *)&structType,(ListReader *)&listValue.schema.elementType.field_4
                   ,false);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  (&local_270,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x244,FAILED,"listValue.getSchema() == listType","\"Value type mismatch.\"",
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::~Fault(&local_270);
      }
      break;
    case ENUM:
      local_128.raw = (RawBrandedSchema *)capnp::Type::asEnum((Type *)&slot._reader.nestingLimit);
      TVar8 = DynamicValue::Reader::getType(value);
      if (TVar8 == TEXT) {
        join_0x00000010_0x00000000_ =
             (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(value);
        EnumSchema::getEnumerantByName
                  (&local_168,(EnumSchema *)&local_128,(StringPtr)join_0x00000010_0x00000000_);
        enumSchema.super_Schema.raw._4_2_ = EnumSchema::Enumerant::getOrdinal(&local_168);
      }
      else {
        TVar8 = DynamicValue::Reader::getType(value);
        if ((TVar8 == INT) || (TVar8 = DynamicValue::Reader::getType(value), TVar8 == UINT)) {
          enumSchema.super_Schema.raw._4_2_ = DynamicValue::Reader::as<unsigned_short>(value);
        }
        else {
          RVar11 = DynamicValue::Reader::as<capnp::DynamicEnum>(value);
          local_198 = (undefined1  [8])RVar11.schema.super_Schema.raw;
          enumValue.schema.super_Schema.raw._0_2_ = RVar11.value;
          f_1.exception = (Exception *)DynamicEnum::getSchema((DynamicEnum *)local_198);
          bVar1 = Schema::operator==((Schema *)&f_1,&local_128);
          if (!bVar1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                      (&local_1b8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                       ,0x22d,FAILED,"enumValue.getSchema() == enumSchema",
                       "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
            kj::_::Debug::Fault::~Fault(&local_1b8);
            return;
          }
          enumSchema.super_Schema.raw._4_2_ = DynamicEnum::getRaw((DynamicEnum *)local_198);
        }
      }
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar5 = assumeDataOffset(uVar6);
      value_05 = enumSchema.super_Schema.raw._4_2_;
      uVar4 = capnp::schema::Value::Reader::getEnum((Reader *)local_118);
      _::StructBuilder::setDataField<unsigned_short>(&this->builder,SVar5,value_05,uVar4);
      break;
    case STRUCT:
      structValue.reader._40_8_ = capnp::Type::asStruct((Type *)&slot._reader.nestingLimit);
      DynamicValue::Reader::as<capnp::DynamicStruct>
                ((ReaderFor<capnp::DynamicStruct> *)local_2c8,value);
      f_3.exception = (Exception *)DynamicStruct::Reader::getSchema((Reader *)local_2c8);
      bVar1 = Schema::operator==((Schema *)&f_3,(Schema *)&structValue.reader.nestingLimit);
      if (bVar1) {
        uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
        SVar7 = assumePointerOffset(uVar6);
        _::StructBuilder::getPointerField
                  ((PointerBuilder *)&target.builder.pointer,&this->builder,SVar7);
        _::PointerBuilder::setStruct
                  ((PointerBuilder *)&target.builder.pointer,(StructReader *)&structValue,false);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  (&local_2d8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x24f,FAILED,"structValue.getSchema() == structType","\"Value type mismatch.\"",
                   (char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::~Fault(&local_2d8);
      }
      break;
    case INTERFACE:
      capability.schema = capnp::Type::asInterface((Type *)&slot._reader.nestingLimit);
      DynamicValue::Reader::as<capnp::DynamicCapability>
                ((ReaderFor<capnp::DynamicCapability> *)local_418,value);
      local_420.raw =
           (RawBrandedSchema *)
           DynamicCapability::Client::getSchema((ReaderFor<capnp::DynamicCapability> *)local_418);
      f_5.exception = (Exception *)capability.schema.super_Schema.raw;
      bVar1 = InterfaceSchema::extends((InterfaceSchema *)&local_420,capability.schema);
      if (bVar1) {
        uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
        SVar7 = assumePointerOffset(uVar6);
        _::StructBuilder::getPointerField
                  ((PointerBuilder *)&src.reader.nestingLimit,&this->builder,SVar7);
        cap = kj::mv<kj::Own<capnp::ClientHook>>((Own<capnp::ClientHook> *)local_418);
        _::PointerBuilder::setCapability((PointerBuilder *)&src.reader.nestingLimit,cap);
      }
      else {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[21]>
                  (&local_430,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x27f,FAILED,"capability.getSchema().extends(interfaceType)",
                   "\"Value type mismatch.\"",(char (*) [21])"Value type mismatch.");
        kj::_::Debug::Fault::~Fault(&local_430);
      }
      DynamicCapability::Client::~Client((Client *)local_418);
      break;
    case ANY_POINTER:
      uVar6 = capnp::schema::Field::Slot::Reader::getOffset((Reader *)&dval._reader.nestingLimit);
      SVar7 = assumePointerOffset(uVar6);
      _::StructBuilder::getPointerField(&local_320,&this->builder,SVar7);
      builder.capTable = local_320.capTable;
      builder.segment = local_320.segment;
      builder.pointer = local_320.pointer;
      AnyPointer::Builder::Builder((Builder *)local_308,builder);
      TVar8 = DynamicValue::Reader::getType(value);
      switch(TVar8) {
      case UNKNOWN:
      case VOID:
      case BOOL:
      case INT:
      case UINT:
      case FLOAT:
      case ENUM:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[41]>
                  ((Fault *)&interfaceType,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
                   ,0x276,FAILED,(char *)0x0,"\"Value type mismatch; expected AnyPointer\"",
                   (char (*) [41])"Value type mismatch; expected AnyPointer");
        kj::_::Debug::Fault::fatal((Fault *)&interfaceType);
      case TEXT:
        local_330.content = (ArrayPtr<const_char>)DynamicValue::Reader::as<capnp::Text>(value);
        AnyPointer::Builder::setAs<capnp::Text>
                  ((Builder *)local_308,(ReaderFor<capnp::Text>)local_330.content);
        break;
      case DATA:
        local_340 = (ArrayPtr<const_unsigned_char>)DynamicValue::Reader::as<capnp::Data>(value);
        AnyPointer::Builder::setAs<capnp::Data>
                  ((Builder *)local_308,(ReaderFor<capnp::Data>)local_340);
        break;
      case LIST:
        DynamicValue::Reader::as<capnp::DynamicList>(&local_380,value);
        value_04.schema.elementType.field_4.schema = local_380.schema.elementType.field_4.schema;
        value_04.schema.elementType.baseType = local_380.schema.elementType.baseType;
        value_04.schema.elementType.listDepth = local_380.schema.elementType.listDepth;
        value_04.schema.elementType.isImplicitParam = local_380.schema.elementType.isImplicitParam;
        value_04.schema.elementType.field_3 = local_380.schema.elementType.field_3;
        value_04.schema.elementType._6_2_ = local_380.schema.elementType._6_2_;
        value_04.reader.segment = local_380.reader.segment;
        value_04.reader.capTable = local_380.reader.capTable;
        value_04.reader.ptr = local_380.reader.ptr;
        value_04.reader.elementCount = local_380.reader.elementCount;
        value_04.reader.step = local_380.reader.step;
        value_04.reader.structDataSize = local_380.reader.structDataSize;
        value_04.reader.structPointerCount = local_380.reader.structPointerCount;
        value_04.reader.elementSize = local_380.reader.elementSize;
        value_04.reader._39_1_ = local_380.reader._39_1_;
        value_04.reader.nestingLimit = local_380.reader.nestingLimit;
        value_04.reader._44_4_ = local_380.reader._44_4_;
        AnyPointer::Builder::setAs<capnp::DynamicList>((Builder *)local_308,value_04);
        break;
      case STRUCT:
        DynamicValue::Reader::as<capnp::DynamicStruct>(&local_3b8,value);
        value_03.reader.segment = local_3b8.reader.segment;
        value_03.schema.super_Schema.raw = local_3b8.schema.super_Schema.raw;
        value_03.reader.capTable = local_3b8.reader.capTable;
        value_03.reader.data = local_3b8.reader.data;
        value_03.reader.pointers = local_3b8.reader.pointers;
        value_03.reader.dataSize = local_3b8.reader.dataSize;
        value_03.reader.pointerCount = local_3b8.reader.pointerCount;
        value_03.reader._38_2_ = local_3b8.reader._38_2_;
        value_03.reader.nestingLimit = local_3b8.reader.nestingLimit;
        value_03.reader._44_4_ = local_3b8.reader._44_4_;
        AnyPointer::Builder::setAs<capnp::DynamicStruct>((Builder *)local_308,value_03);
        break;
      case CAPABILITY:
        DynamicValue::Reader::as<capnp::DynamicCapability>(&local_3d0,value);
        AnyPointer::Builder::setAs<capnp::DynamicCapability>((Builder *)local_308,&local_3d0);
        DynamicCapability::Client::~Client(&local_3d0);
        break;
      case ANY_POINTER:
        DynamicValue::Reader::as<capnp::AnyPointer>((ReaderFor<capnp::AnyPointer> *)&f_4,value);
        value_02.reader.capTable = local_3e8;
        value_02.reader.segment = (SegmentReader *)f_4.exception;
        value_02.reader.pointer = local_3e0;
        value_02.reader._24_8_ = local_3d8;
        AnyPointer::Builder::set((Builder *)local_308,value_02);
        break;
      default:
        kj::_::unreachable();
      }
      break;
    default:
      kj::_::unreachable();
    }
    return;
  }
  if (WVar2 == GROUP) {
    DynamicValue::Reader::as<capnp::DynamicStruct>
              ((ReaderFor<capnp::DynamicStruct> *)&dst.builder.dataSize,value);
    unionField.field_1._56_8_ = field.parent.super_Schema.raw;
    init((Builder *)&local_4f8,(EVP_PKEY_CTX *)this);
    DynamicValue::Builder::as<capnp::DynamicStruct>
              ((BuilderFor<capnp::DynamicStruct> *)local_4b8,&local_4f8);
    DynamicValue::Builder::~Builder(&local_4f8);
    DynamicStruct::Reader::which(&local_5c8,(Reader *)&dst.builder.dataSize);
    other = kj::_::readMaybe<capnp::StructSchema::Field>(&local_5c8);
    kj::_::NullableValue<capnp::StructSchema::Field>::NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_580,other);
    kj::Maybe<capnp::StructSchema::Field>::~Maybe(&local_5c8);
    pFVar10 = kj::_::NullableValue::operator_cast_to_Field_((NullableValue *)local_580);
    if (pFVar10 != (Field *)0x0) {
      pFVar10 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                          ((NullableValue<capnp::StructSchema::Field> *)local_580);
      local_608 = (pFVar10->parent).super_Schema.raw;
      uStack_600 = *(undefined8 *)&pFVar10->index;
      local_5f8 = (pFVar10->proto)._reader.segment;
      pCStack_5f0 = (pFVar10->proto)._reader.capTable;
      local_5e8 = (pFVar10->proto)._reader.data;
      pWStack_5e0 = (pFVar10->proto)._reader.pointers;
      local_5d8._0_4_ = (pFVar10->proto)._reader.dataSize;
      local_5d8._4_2_ = (pFVar10->proto)._reader.pointerCount;
      local_5d8._6_2_ = *(undefined2 *)&(pFVar10->proto)._reader.field_0x26;
      uStack_5d0 = *(undefined8 *)&(pFVar10->proto)._reader.nestingLimit;
      pFVar10 = kj::_::NullableValue<capnp::StructSchema::Field>::operator*
                          ((NullableValue<capnp::StructSchema::Field> *)local_580);
      DynamicStruct::Reader::get(&local_650,(Reader *)&dst.builder.dataSize,*pFVar10);
      field_00._8_8_ = uStack_600;
      field_00.parent.super_Schema.raw = (Schema)(Schema)local_608;
      field_00.proto._reader.segment = local_5f8;
      field_00.proto._reader.capTable = pCStack_5f0;
      field_00.proto._reader.data = local_5e8;
      field_00.proto._reader.pointers = pWStack_5e0;
      field_00.proto._reader.dataSize = (undefined4)local_5d8;
      field_00.proto._reader.pointerCount = local_5d8._4_2_;
      field_00.proto._reader._38_2_ = local_5d8._6_2_;
      field_00.proto._reader._40_8_ = uStack_5d0;
      set((Builder *)local_4b8,field_00,&local_650);
      DynamicValue::Reader::~Reader(&local_650);
    }
    kj::_::NullableValue<capnp::StructSchema::Field>::~NullableValue
              ((NullableValue<capnp::StructSchema::Field> *)local_580);
    __return_storage_ptr___00 = &__begin3.index;
    StructSchema::getNonUnionFields
              ((FieldSubset *)__return_storage_ptr___00,(StructSchema *)&dst.builder.dataSize);
    IVar12 = StructSchema::FieldSubset::begin((FieldSubset *)__return_storage_ptr___00);
    __end3._8_8_ = IVar12.container;
    __begin3.container._0_4_ = IVar12.index;
    local_6f8 = (undefined1  [8])__end3._8_8_;
    IVar12 = StructSchema::FieldSubset::end((FieldSubset *)__return_storage_ptr___00);
    field_1.proto._reader._40_8_ = IVar12.container;
    __end3.container._0_4_ = IVar12.index;
    local_718 = (undefined1  [8])field_1.proto._reader._40_8_;
    while (bVar1 = _::
                   IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                   ::operator!=((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                                 *)local_6f8,
                                (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                                 *)local_718), bVar1) {
      _::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
      operator*((Field *)auStack_768,
                (IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                 *)local_6f8);
      memcpy(&local_7a8,auStack_768,0x40);
      field_01._8_8_ = uStack_7a0;
      field_01.parent.super_Schema.raw = (Schema)(Schema)local_7a8;
      field_01.proto._reader.segment = (SegmentReader *)local_798;
      field_01.proto._reader.capTable = (CapTableReader *)uStack_790;
      field_01.proto._reader.data = (void *)local_788;
      field_01.proto._reader.pointers = (WirePointer *)uStack_780;
      field_01.proto._reader.dataSize = (undefined4)local_778;
      field_01.proto._reader.pointerCount = local_778._4_2_;
      field_01.proto._reader._38_2_ = local_778._6_2_;
      field_01.proto._reader._40_8_ = uStack_770;
      bVar1 = DynamicStruct::Reader::has((Reader *)&dst.builder.dataSize,field_01,NON_NULL);
      if (bVar1) {
        local_7b8 = field_1.proto._reader.pointers;
        SStack_7b0 = field_1.proto._reader.dataSize;
        SStack_7ac = field_1.proto._reader.pointerCount;
        uStack_7aa = field_1.proto._reader._38_2_;
        local_7c8 = field_1.proto._reader.capTable;
        pvStack_7c0 = field_1.proto._reader.data;
        local_7d8 = field_1.index;
        uStack_7d4 = field_1._12_4_;
        pSStack_7d0 = field_1.proto._reader.segment;
        local_7e8.raw = (RawBrandedSchema *)auStack_768;
        SStack_7e0 = field_1.parent.super_Schema.raw;
        field_02._8_8_ = field_1.parent.super_Schema.raw;
        field_02.parent.super_Schema.raw = (Schema)(Schema)auStack_768;
        field_02.proto._reader.segment = (SegmentReader *)field_1._8_8_;
        field_02.proto._reader.capTable = (CapTableReader *)field_1.proto._reader.segment;
        field_02.proto._reader.data = field_1.proto._reader.capTable;
        field_02.proto._reader.pointers = (WirePointer *)field_1.proto._reader.data;
        field_02.proto._reader._32_8_ = field_1.proto._reader.pointers;
        field_02.proto._reader.nestingLimit = field_1.proto._reader.dataSize;
        field_02.proto._reader._44_2_ = field_1.proto._reader.pointerCount;
        field_02.proto._reader._46_2_ = field_1.proto._reader._38_2_;
        DynamicStruct::Reader::get(&local_830,(Reader *)&dst.builder.dataSize,field_02);
        field_03._8_8_ = SStack_7e0.raw;
        field_03.parent.super_Schema.raw = (Schema)(Schema)local_7e8.raw;
        field_03.proto._reader.segment = (SegmentReader *)_local_7d8;
        field_03.proto._reader.capTable = (CapTableReader *)pSStack_7d0;
        field_03.proto._reader.data = local_7c8;
        field_03.proto._reader.pointers = (WirePointer *)pvStack_7c0;
        field_03.proto._reader._32_8_ = local_7b8;
        field_03.proto._reader.nestingLimit = SStack_7b0;
        field_03.proto._reader._44_2_ = SStack_7ac;
        field_03.proto._reader._46_2_ = uStack_7aa;
        set((Builder *)local_4b8,field_03,&local_830);
        DynamicValue::Reader::~Reader(&local_830);
      }
      _::IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>::
      operator++((IndexingIterator<const_capnp::StructSchema::FieldSubset,_capnp::StructSchema::Field>
                  *)local_6f8);
    }
  }
  kj::_::unreachable();
}

Assistant:

void DynamicStruct::Builder::set(StructSchema::Field field, const DynamicValue::Reader& value) {
  KJ_REQUIRE(field.getContainingStruct() == schema, "`field` is not a field of this struct.");
  setInUnion(field);

  auto proto = field.getProto();
  auto type = field.getType();
  switch (proto.which()) {
    case schema::Field::SLOT: {
      auto slot = proto.getSlot();
      auto dval = slot.getDefaultValue();

      switch (type.which()) {
        case schema::Type::VOID:
          builder.setDataField<Void>(assumeDataOffset(slot.getOffset()), value.as<Void>());
          return;

#define HANDLE_TYPE(discrim, titleCase, type) \
        case schema::Type::discrim: \
          builder.setDataField<type>( \
              assumeDataOffset(slot.getOffset()), value.as<type>(), \
              bitCast<_::Mask<type> >(dval.get##titleCase())); \
          return;

        HANDLE_TYPE(BOOL, Bool, bool)
        HANDLE_TYPE(INT8, Int8, int8_t)
        HANDLE_TYPE(INT16, Int16, int16_t)
        HANDLE_TYPE(INT32, Int32, int32_t)
        HANDLE_TYPE(INT64, Int64, int64_t)
        HANDLE_TYPE(UINT8, Uint8, uint8_t)
        HANDLE_TYPE(UINT16, Uint16, uint16_t)
        HANDLE_TYPE(UINT32, Uint32, uint32_t)
        HANDLE_TYPE(UINT64, Uint64, uint64_t)
        HANDLE_TYPE(FLOAT32, Float32, float)
        HANDLE_TYPE(FLOAT64, Float64, double)

#undef HANDLE_TYPE

        case schema::Type::ENUM: {
          uint16_t rawValue;
          auto enumSchema = type.asEnum();
          if (value.getType() == DynamicValue::TEXT) {
            // Convert from text.
            rawValue = enumSchema.getEnumerantByName(value.as<Text>()).getOrdinal();
          } else if (value.getType() == DynamicValue::INT ||
                     value.getType() == DynamicValue::UINT) {
            rawValue = value.as<uint16_t>();
          } else {
            DynamicEnum enumValue = value.as<DynamicEnum>();
            KJ_REQUIRE(enumValue.getSchema() == enumSchema, "Value type mismatch.") {
              return;
            }
            rawValue = enumValue.getRaw();
          }
          builder.setDataField<uint16_t>(assumeDataOffset(slot.getOffset()), rawValue,
                                         dval.getEnum());
          return;
        }

        case schema::Type::TEXT:
          builder.getPointerField(assumePointerOffset(slot.getOffset()))
                 .setBlob<Text>(value.as<Text>());
          return;

        case schema::Type::DATA:
          builder.getPointerField(assumePointerOffset(slot.getOffset()))
                 .setBlob<Data>(value.as<Data>());
          return;

        case schema::Type::LIST: {
          ListSchema listType = type.asList();
          auto listValue = value.as<DynamicList>();
          KJ_REQUIRE(listValue.getSchema() == listType, "Value type mismatch.") {
            return;
          }
          builder.getPointerField(assumePointerOffset(slot.getOffset()))
                 .setList(listValue.reader);
          return;
        }

        case schema::Type::STRUCT: {
          auto structType = type.asStruct();
          auto structValue = value.as<DynamicStruct>();
          KJ_REQUIRE(structValue.getSchema() == structType, "Value type mismatch.") {
            return;
          }
          builder.getPointerField(assumePointerOffset(slot.getOffset()))
                 .setStruct(structValue.reader);
          return;
        }

        case schema::Type::ANY_POINTER: {
          auto target = AnyPointer::Builder(
              builder.getPointerField(assumePointerOffset(slot.getOffset())));

          switch (value.getType()) {
            case DynamicValue::Type::TEXT:
              target.setAs<Text>(value.as<Text>());
              return;
            case DynamicValue::Type::DATA:
              target.setAs<Data>(value.as<Data>());
              return;
            case DynamicValue::Type::LIST:
              target.setAs<DynamicList>(value.as<DynamicList>());
              return;
            case DynamicValue::Type::STRUCT:
              target.setAs<DynamicStruct>(value.as<DynamicStruct>());
              return;
            case DynamicValue::Type::CAPABILITY:
              target.setAs<DynamicCapability>(value.as<DynamicCapability>());
              return;
            case DynamicValue::Type::ANY_POINTER:
              target.set(value.as<AnyPointer>());
              return;

            case DynamicValue::Type::UNKNOWN:
            case DynamicValue::Type::VOID:
            case DynamicValue::Type::BOOL:
            case DynamicValue::Type::INT:
            case DynamicValue::Type::UINT:
            case DynamicValue::Type::FLOAT:
            case DynamicValue::Type::ENUM:
              KJ_FAIL_ASSERT("Value type mismatch; expected AnyPointer");
          }

          KJ_UNREACHABLE;
        }

        case schema::Type::INTERFACE: {
          auto interfaceType = type.asInterface();
          auto capability = value.as<DynamicCapability>();
          KJ_REQUIRE(capability.getSchema().extends(interfaceType), "Value type mismatch.") {
            return;
          }
          builder.getPointerField(assumePointerOffset(slot.getOffset()))
                 .setCapability(kj::mv(capability.hook));
          return;
        }
      }

      KJ_UNREACHABLE;
    }

    case schema::Field::GROUP: {
      auto src = value.as<DynamicStruct>();
      auto dst = init(field).as<DynamicStruct>();

      KJ_IF_MAYBE(unionField, src.which()) {
        dst.set(*unionField, src.get(*unionField));
      }

      for (auto field: src.schema.getNonUnionFields()) {
        if (src.has(field)) {
          dst.set(field, src.get(field));
        }
      }
    }
  }

  KJ_UNREACHABLE;
}